

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O2

QString * __thiscall QTextCursor::selectedText(QString *__return_storage_ptr__,QTextCursor *this)

{
  QTextDocumentPrivate *pQVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QTextTable *pQVar6;
  int iVar7;
  QTextCursorPrivate *this_00;
  int c;
  int iVar8;
  int iVar9;
  long in_FS_OFFSET;
  int num_cols;
  int num_rows;
  int col_start;
  int row_start;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  QArrayDataPointer<char16_t> local_60;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d).d.ptr;
  if (((this_00 == (QTextCursorPrivate *)0x0) ||
      (pQVar1 = this_00->priv, pQVar1 == (QTextDocumentPrivate *)0x0)) ||
     (this_00->position == this_00->anchor)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0044d76f;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    local_60.d = (pQVar1->text).d.d;
    local_60.ptr = (pQVar1->text).d.ptr;
    local_60.size = (pQVar1->text).d.size;
    if (local_60.d != (Data *)0x0) {
      LOCK();
      ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      this_00 = (this->d).d.ptr;
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    pQVar6 = QTextCursorPrivate::complexSelectionTable(this_00);
    if (pQVar6 == (QTextTable *)0x0) {
      pQVar1 = ((this->d).d.ptr)->priv;
      iVar5 = selectionStart(this);
      iVar7 = selectionEnd(this);
      getText(__return_storage_ptr__,pQVar1,(QString *)&local_60,iVar5,iVar7);
    }
    else {
      local_64 = -0x55555556;
      local_68 = -0x55555556;
      local_6c = -0x55555556;
      local_70 = -0x55555556;
      selectedTableCells(this,&local_64,&local_6c,&local_68,&local_70);
      iVar5 = local_68;
      iVar2 = local_6c + local_64;
      iVar9 = local_70 + local_68;
      for (iVar7 = local_64; iVar8 = iVar5, iVar7 < iVar2; iVar7 = iVar7 + 1) {
        for (; iVar8 < iVar9; iVar8 = iVar8 + 1) {
          local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QTextTable::cellAt((QTextTable *)local_48,(int)pQVar6,iVar7);
          iVar3 = QTextTableCell::rowSpan((QTextTableCell *)local_48);
          iVar4 = QTextTableCell::columnSpan((QTextTableCell *)local_48);
          if (((iVar3 == 1) ||
              (iVar3 = QTextTableCell::row((QTextTableCell *)local_48), iVar3 == iVar7)) &&
             ((iVar4 == 1 ||
              (iVar3 = QTextTableCell::column((QTextTableCell *)local_48), iVar8 == iVar3)))) {
            pQVar1 = ((this->d).d.ptr)->priv;
            iVar3 = QTextTableCell::firstPosition((QTextTableCell *)local_48);
            iVar4 = QTextTableCell::lastPosition((QTextTableCell *)local_48);
            getText(__return_storage_ptr__,pQVar1,(QString *)&local_60,iVar3,iVar4);
          }
        }
      }
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_0044d76f:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QTextCursor::selectedText() const
{
    if (!d || !d->priv || d->position == d->anchor)
        return QString();

    const QString docText = d->priv->buffer();
    QString text;

    QTextTable *table = d->complexSelectionTable();
    if (table) {
        int row_start, col_start, num_rows, num_cols;
        selectedTableCells(&row_start, &num_rows, &col_start, &num_cols);

        Q_ASSERT(row_start != -1);
        for (int r = row_start; r < row_start + num_rows; ++r) {
            for (int c = col_start; c < col_start + num_cols; ++c) {
                QTextTableCell cell = table->cellAt(r, c);
                int rspan = cell.rowSpan();
                int cspan = cell.columnSpan();
                if (rspan != 1) {
                    int cr = cell.row();
                    if (cr != r)
                        continue;
                }
                if (cspan != 1) {
                    int cc = cell.column();
                    if (cc != c)
                        continue;
                }

                getText(text, d->priv, docText, cell.firstPosition(), cell.lastPosition());
            }
        }
    } else {
        getText(text, d->priv, docText, selectionStart(), selectionEnd());
    }

    return text;
}